

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O1

void __thiscall ProblemFireFighting::FillTransitionModel(ProblemFireFighting *this)

{
  TransitionModelDiscrete *pTVar1;
  Index IVar2;
  long lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ja_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s1_vec_stripped;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s2_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s1_vec;
  void *local_a0;
  undefined8 local_98;
  long local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_88;
  double local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  void *local_60;
  undefined8 local_58;
  long local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  lVar3 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscrete.
                                 super_MultiAgentDecisionProcess + 0x70))();
  if (lVar3 != 0) {
    local_88 = &this->_m_nrFLs_vec;
    uVar6 = 0;
    do {
      lVar3 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0x30))(this);
      if (lVar3 != 0) {
        uVar5 = 0;
        do {
          IndexTools::JointToIndividualIndices
                    (&local_48,(Index)uVar5,&this->_m_nrPerStateFeatureVec);
          if (this->_m_nrJointFirelevels != 0) {
            uVar4 = 0;
            do {
              IndexTools::JointToIndividualIndices
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
                         (Index)uVar4,local_88);
              std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start +
                         *(long *)&(this->super_DecPOMDPDiscrete).field_0x228,
                         (allocator_type *)&local_a0);
              __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                           super_MultiAgentDecisionProcessDiscrete.
                                           super_MultiAgentDecisionProcess + 0xa0))(this,uVar6);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,__x);
              local_80 = ComputeTransitionProb
                                   (this,&local_78,
                                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0
                                    ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     &local_60);
              if (0.0 < local_80) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_60,local_58,
                           local_a0,local_98);
                IVar2 = IndexTools::IndividualToJointIndices
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
                                   &this->_m_nrPerStateFeatureVec);
                pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         _m_p_tModel;
                (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel.
                  _vptr_TransitionModel[5])(local_80,pTVar1,uVar5,uVar6,(ulong)IVar2);
              }
              if (local_a0 != (void *)0x0) {
                operator_delete(local_a0,local_90 - (long)local_a0);
              }
              if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_78.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_78.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_60 != (void *)0x0) {
                operator_delete(local_60,local_50 - (long)local_60);
              }
              uVar4 = (ulong)((Index)uVar4 + 1);
            } while (uVar4 < this->_m_nrJointFirelevels);
          }
          if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
            operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar5 = (ulong)((Index)uVar5 + 1);
          uVar4 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                         super_MultiAgentDecisionProcessDiscrete.
                                         super_MultiAgentDecisionProcess + 0x30))(this);
        } while (uVar5 < uVar4);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar5 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0x70))(this);
    } while (uVar6 < uVar5);
  }
  return;
}

Assistant:

void ProblemFireFighting::FillTransitionModel()
{
    // add transitions:
    for(Index ja=0; ja<GetNrJointActions(); ja++)
        for(Index s1=0; s1<GetNrStates();s1++) 
        {
#if DEBUG_CTM
            cout << "Transitions from s1="<<s1<<endl;
#endif
            vector< Index > s1_vec = GetStateVector(s1);
/* skip check for matlab generation compatibility            
            size_t nrSPs1 = NumberOfContainedStartPositions(s1_vec);
            if(nrSPs1 > 0 && nrSPs1 != GetNrAgents())
            {
                //illegal state, the prob. is zero except for transition
                //to self:
                SetTransitionProbability(s1, ja, s1, 1.0);
                //else 0, but we do not need to add that
                continue;
            }
*/
            //Since movements are deterministic, we can simply fill out
            //the position elements of the state factor
            //therefore we only need to loop over joint-firelevel vectors 
            //here
            for(Index s2=0; s2<_m_nrJointFirelevels;s2++) 
            {
                vector< Index > s2_vec = IndexTools::JointToIndividualIndices
                    (s2, _m_nrFLs_vec);
                //no longer necessary since we fill in the position components
                //if(NumberOfContainedStartPositions(s2_vec) > 0)
                    //continue;

                vector< Index > s1_vec_stripped(&s1_vec[0], 
                        &s1_vec[_m_nrHouses] );
                vector< Index > ja_vec = JointToIndividualActionIndices(ja);
                double p = ComputeTransitionProb(s1_vec_stripped, 
                        ja_vec, s2_vec);
#if DEBUG_CTM
                cout << "Trans from s="
                    << SoftPrintVector(s1_vec) 
                    << ", a=" 
                    << SoftPrintVector(ja_vec) 
                    << " to s'="
                    << SoftPrintVector(s2_vec) 
                    << " Prob=" << p << endl;
#endif
                if(p > 0.0)
                {
                    //compute full s2 index
                    vector< Index >& full_s2 = s2_vec;
                    full_s2.insert(full_s2.end(), ja_vec.begin(), ja_vec.end());
                    Index fs2I = IndexTools::IndividualToJointIndices(full_s2, 
                            _m_nrPerStateFeatureVec);
                    SetTransitionProbability(s1, ja, fs2I, p);
                }
            }
        }
}